

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall
sptk::reaper::EpochTracker::HilbertTransform
          (EpochTracker *this,int16_t *input,int32_t n_input,float *output)

{
  float fVar1;
  int i;
  int power;
  float *x;
  float *y;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  FFT ft;
  
  power = FFT::fft_pow2_from_window_size(n_input);
  FFT::FFT(&ft,power);
  lVar6 = (long)ft.fftSize;
  uVar2 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar2 = lVar6 * 4;
  }
  x = (float *)operator_new__(uVar2);
  y = (float *)operator_new__(uVar2);
  uVar2 = 0;
  uVar5 = 0;
  if (0 < n_input) {
    uVar5 = (ulong)(uint)n_input;
  }
  for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    x[uVar2] = (float)(int)input[uVar2];
    y[uVar2] = 0.0;
  }
  for (lVar3 = (long)n_input; lVar3 < lVar6; lVar3 = lVar3 + 1) {
    x[lVar3] = 0.0;
    y[lVar3] = 0.0;
  }
  FFT::fft(&ft,x,y);
  lVar4 = (long)(ft.fftSize / 2);
  for (lVar3 = 1; lVar3 < lVar4; lVar3 = lVar3 + 1) {
    fVar1 = y[lVar3];
    y[lVar3] = -x[lVar3];
    x[lVar3] = fVar1;
  }
  *y = 0.0;
  *x = 0.0;
  while (lVar4 = lVar4 + 1, lVar4 < lVar6) {
    fVar1 = y[lVar4];
    y[lVar4] = x[lVar4];
    x[lVar4] = -fVar1;
  }
  FFT::ifft(&ft,x,y);
  for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    output[uVar2] = x[uVar2] / (float)ft.fftSize;
  }
  operator_delete__(x);
  operator_delete__(y);
  FFT::~FFT(&ft);
  return;
}

Assistant:

void EpochTracker::HilbertTransform(int16_t* input, int32_t n_input,
                                    float* output) {
  FFT ft = FFT(FFT::fft_pow2_from_window_size(n_input));
  int32_t n_fft = ft.get_fftSize();
  float* re = new float[n_fft];
  float* im = new float[n_fft];
  for (int i = 0; i < n_input; ++i) {
    re[i] = input[i];
    im[i] = 0.0;
  }
  for (int i = n_input; i < n_fft; ++i) {
    re[i] = 0.0;
    im[i] = 0.0;
  }
  ft.fft(re, im);
  for (int i = 1; i < n_fft/2; ++i) {
    float tmp = im[i];
    im[i] = -re[i];
    re[i] = tmp;
  }
  re[0] = im[0] = 0.0;
  for (int i = n_fft/2 + 1; i < n_fft; ++i) {
    float tmp = im[i];
    im[i] = re[i];
    re[i] = -tmp;
  }
  ft.ifft(re, im);
  for (int i = 0; i < n_input; ++i) {
    output[i] = re[i] / n_fft;
  }
  delete [] re;
  delete [] im;
}